

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

uint findindex(lua_State *L,Table *t,StkId key)

{
  int iVar1;
  Node *local_38;
  Node *n;
  int nx;
  uint i;
  StkId key_local;
  Table *t_local;
  lua_State *L_local;
  
  if (key->tt_ == 0) {
    L_local._4_4_ = 0;
  }
  else {
    L_local._4_4_ = arrayindex(key);
    if ((L_local._4_4_ == 0) || (t->sizearray < L_local._4_4_)) {
      for (local_38 = mainposition(t,key);
          (iVar1 = luaV_equalobj((lua_State *)0x0,&(local_38->i_key).tvk,key), iVar1 == 0 &&
          ((((local_38->i_key).nk.tt_ != 10 || ((key->tt_ & 0x40U) == 0)) ||
           ((local_38->i_key).nk.value_.gc != (key->value_).gc)))); local_38 = local_38 + iVar1) {
        iVar1 = (local_38->i_key).nk.next;
        if (iVar1 == 0) {
          luaG_runerror(L,"invalid key to \'next\'");
        }
      }
      L_local._4_4_ = (int)((long)local_38 - (long)t->node >> 5) + 1 + t->sizearray;
    }
  }
  return L_local._4_4_;
}

Assistant:

static unsigned int findindex (lua_State *L, Table *t, StkId key) {
  unsigned int i;
  if (ttisnil(key)) return 0;  /* first iteration */
  i = arrayindex(key);
  if (i != 0 && i <= t->sizearray)  /* is 'key' inside array part? */
    return i;  /* yes; that's the index */
  else {
    int nx;
    Node *n = mainposition(t, key);
    for (;;) {  /* check whether 'key' is somewhere in the chain */
      /* key may be dead already, but it is ok to use it in 'next' */
      if (luaV_rawequalobj(gkey(n), key) ||
            (ttisdeadkey(gkey(n)) && iscollectable(key) &&
             deadvalue(gkey(n)) == gcvalue(key))) {
        i = cast_int(n - gnode(t, 0));  /* key index in hash table */
        /* hash elements are numbered after array ones */
        return (i + 1) + t->sizearray;
      }
      nx = gnext(n);
      if (nx == 0)
        luaG_runerror(L, "invalid key to 'next'");  /* key not found */
      else n += nx;
    }
  }
}